

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnificationWithAbstraction.cpp
# Opt level: O0

FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *
Kernel::FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RealConstantType>_>_>::
scanAdd(AbstractingUnifier *au,TermSpec *t0,TermSpec *t1)

{
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_> *in_RDI;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *in_stack_ffffffffffffff08;
  FloorUwaState<Kernel::AlascaSignature<Kernel::NumTraits<Kernel::RationalConstantType>_>_>
  *in_stack_ffffffffffffff10;
  AbstractingUnifier *in_stack_ffffffffffffff18;
  TermSpec *in_stack_ffffffffffffff98;
  AbstractingUnifier *in_stack_ffffffffffffffa0;
  
  scan(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  scan(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  add(in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
  ~FloorUwaState(in_RDI);
  ~FloorUwaState(in_RDI);
  return in_RDI;
}

Assistant:

static FloorUwaState scanAdd(AbstractingUnifier& au, TermSpec const& t0, TermSpec const& t1) { return add(au, scan(au, t0), scan(au, t1)); }